

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O1

prsndef * prsxun(prscxdef *ctx,prsbdef *binctx)

{
  tokdef *tokp;
  uchar uVar1;
  ushort uVar2;
  int iVar3;
  prsndef *ppVar4;
  prsndef *ppVar5;
  prsndef *n3;
  uint t;
  prsbdef *ppVar6;
  tokcxdef *ptVar7;
  tokdef tok;
  tokdef local_a0;
  
  ptVar7 = ctx->prscxtok;
  t = (ptVar7->tokcxcur).toktyp;
  if ((int)t < 0x5e) {
    if ((t < 0x1f) && ((0x4000004cU >> (t & 0x1f) & 1) != 0)) {
LAB_0012047d:
      toknext(ptVar7);
      ppVar4 = prsxun(ctx,binctx);
LAB_00120490:
      ppVar4 = prsnew1(ctx,t,ppVar4);
      return ppVar4;
    }
  }
  else if ((int)t < 0x96) {
    if (t == 0x5e) {
      iVar3 = toknext(ptVar7);
      if (iVar3 == 0x49) {
        toknext(ctx->prscxtok);
        local_a0.toktyp = 0x5e;
        ppVar4 = prsnew0(ctx,&local_a0);
        return ppVar4;
      }
      ppVar4 = prsxun(ctx,binctx);
      t = 0x5e;
      goto LAB_00120490;
    }
    if (t == 0x5f) goto LAB_0012047d;
  }
  else if ((t == 0x96) || (t == 0x98)) goto LAB_0012047d;
  tokp = &ptVar7->tokcxcur;
  if ((int)t < 0x4d) {
    switch(t) {
    case 0x32:
      toknext(ptVar7);
      uVar2 = ctx->prscxflg;
      ctx->prscxflg = uVar2 & 0xfffb;
      ppVar6 = &prsb_cma_C;
      if ((ctx->prscxtok->tokcxflg & 4) == 0) {
        ppVar6 = &prsb_cma;
      }
      ppVar4 = prsxbin(ctx,ppVar6);
      ctx->prscxflg = uVar2;
      prsreq(ctx,0x33);
      goto LAB_00120708;
    case 0x33:
    case 0x34:
    case 0x39:
switchD_00120504_caseD_33:
      errsigf(ctx->prscxerr,"TADS",0x12f);
    case 0x35:
    case 0x36:
    case 0x37:
      goto switchD_00120504_caseD_35;
    case 0x38:
      ppVar4 = prsnew0(ctx,tokp);
      toknext(ctx->prscxtok);
      if (((ppVar4->prsnv).prsnvt.toksym.tokstyp != '\t') || (tokp->toktyp != 0x38))
      goto LAB_00120708;
      ppVar4 = prsnew0(ctx,tokp);
      ppVar4 = prsnew1(ctx,0x20,ppVar4);
      break;
    case 0x3a:
      toknext(ptVar7);
      ptVar7 = ctx->prscxtok;
      if ((ptVar7->tokcxcur).toktyp == 0x3b) {
        ppVar4 = (prsndef *)0x0;
      }
      else {
        ppVar4 = (prsndef *)0x0;
        do {
          uVar2 = (ushort)*(undefined4 *)&ctx->prscxflg;
          ctx->prscxflg = uVar2 | 4;
          ppVar6 = &prsb_asi;
          if ((ptVar7->tokcxflg & 4) != 0) {
            ppVar6 = &prsb_asi_C;
          }
          ppVar5 = prsxbin(ctx,ppVar6);
          ctx->prscxflg = uVar2;
          ppVar4 = prsnew2(ctx,0x3b,ppVar5,ppVar4);
          if ((ctx->prscxtok->tokcxcur).toktyp == 0x3f) {
            toknext(ctx->prscxtok);
          }
          ptVar7 = ctx->prscxtok;
        } while ((ptVar7->tokcxcur).toktyp != 0x3b);
      }
      toknext(ptVar7);
      if (ppVar4 != (prsndef *)0x0) goto LAB_00120708;
      local_a0.toktyp = 0x4c;
      local_a0.tokofs = 0;
LAB_001206ef:
      ppVar4 = prsnew0(ctx,&local_a0);
      goto LAB_00120708;
    default:
      if (t != 0xe) goto switchD_00120504_caseD_33;
      goto LAB_0012059f;
    }
  }
  else {
    if (1 < t - 0x4d) {
      if (t != 0x55) goto switchD_00120504_caseD_33;
LAB_0012059f:
      toknext(ptVar7);
      if (((ctx->prscxtok->tokcxcur).toktyp != 0x38) ||
         ((uVar1 = (ctx->prscxtok->tokcxcur).toksym.tokstyp, uVar1 != '\b' && (uVar1 != '\x01')))) {
        local_a0.tokofs = prsrqpr(ctx);
        local_a0.toktyp = 0x55;
        goto LAB_001206ef;
      }
    }
switchD_00120504_caseD_35:
    ppVar4 = prsnew0(ctx,tokp);
  }
  toknext(ctx->prscxtok);
LAB_00120708:
  do {
    while( true ) {
      ptVar7 = ctx->prscxtok;
      iVar3 = (ptVar7->tokcxcur).toktyp;
      if (0x3f < iVar3) break;
      if (iVar3 == 0x32) {
        iVar3 = toknext(ptVar7);
        if (iVar3 == 0x33) {
          toknext(ctx->prscxtok);
          ppVar4 = prsnew1(ctx,0x32,ppVar4);
        }
        else {
          ppVar5 = prsxarg(ctx);
          iVar3 = 0x32;
LAB_001208ed:
          ppVar4 = prsnew2(ctx,iVar3,ppVar4,ppVar5);
        }
      }
      else {
        if (iVar3 != 0x3a) {
          return ppVar4;
        }
        if ((ctx->prscxflg & 4) != 0) {
          return ppVar4;
        }
        toknext(ptVar7);
        uVar2 = ctx->prscxflg;
        ctx->prscxflg = uVar2 & 0xfffb;
        ppVar6 = &prsb_cma_C;
        if ((ctx->prscxtok->tokcxflg & 4) == 0) {
          ppVar6 = &prsb_cma;
        }
        ppVar5 = prsxbin(ctx,ppVar6);
        ctx->prscxflg = uVar2;
        ppVar4 = prsnew2(ctx,0x3a,ppVar4,ppVar5);
        prsreq(ctx,0x3b);
      }
    }
    if (iVar3 != 0x40) {
      if ((iVar3 != 0x96) && (iVar3 != 0x98)) {
        return ppVar4;
      }
      ppVar4 = prsnew1(ctx,iVar3 + 1,ppVar4);
      toknext(ctx->prscxtok);
      return ppVar4;
    }
    iVar3 = toknext(ptVar7);
    ptVar7 = ctx->prscxtok;
    if (iVar3 == 0x32) {
      toknext(ptVar7);
      uVar2 = ctx->prscxflg;
      ctx->prscxflg = uVar2 & 0xfffb;
      ppVar6 = &prsb_cma_C;
      if ((ctx->prscxtok->tokcxflg & 4) == 0) {
        ppVar6 = &prsb_cma;
      }
      ppVar5 = prsxbin(ctx,ppVar6);
      ctx->prscxflg = uVar2;
      prsreq(ctx,0x33);
    }
    else if (((ptVar7->tokcxcur).toktyp == 0x38) && ((ptVar7->tokcxcur).toksym.tokstyp == '\x04')) {
      ppVar5 = prsnew0(ctx,&ptVar7->tokcxcur);
      toknext(ctx->prscxtok);
    }
    else {
      local_a0.tokofs = prsrqpr(ctx);
      local_a0.toktyp = 0x55;
      ppVar5 = prsnew0(ctx,&local_a0);
    }
    if ((ctx->prscxtok->tokcxcur).toktyp != 0x32) {
      iVar3 = 0x40;
      goto LAB_001208ed;
    }
    toknext(ctx->prscxtok);
    n3 = prsxarg(ctx);
    ppVar4 = prsnew3(ctx,0x40,ppVar4,ppVar5,n3);
  } while( true );
}

Assistant:

static prsndef *prsxun(prscxdef *ctx, prsbdef *binctx)
{
    int      t;
    
    VARUSED(binctx);

    t = ctx->prscxtok->tokcxcur.toktyp;
    if (t == TOKTPLUS || t == TOKTMINUS || t == TOKTNOT
        || t == TOKTINC || t == TOKTDEC || t == TOKTTILDE
        || t == TOKTDELETE)
    {
        toknext(ctx->prscxtok);
        return(prsnew1(ctx, t, prsxun(ctx, (prsbdef *)0)));
    }
    else if (t == TOKTNEW)
    {
        if (toknext(ctx->prscxtok) == TOKTOBJECT)
        {
            tokdef tok;

            toknext(ctx->prscxtok);
            tok.toktyp = TOKTNEW;
            return prsnew0(ctx, &tok);
        }
        else
            return prsnew1(ctx, t, prsxun(ctx, (prsbdef *)0));
    }
    return(prsxmem(ctx));
}